

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O0

Contrib_List *
crnlib::Resampler::make_clist
          (int src_x,int dst_x,Boundary_Op boundary_op,_func_Resample_Real_Resample_Real *Pfilter,
          Resample_Real filter_support,Resample_Real filter_scale,Resample_Real src_ofs)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  code *in_RCX;
  int in_ESI;
  int in_EDI;
  float in_XMM0_Da;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  float in_XMM1_Da;
  float in_XMM2_Da;
  Resample_Real norm_1;
  Resample_Real max_w_1;
  int max_k_1;
  int total_1;
  Resample_Real norm;
  Resample_Real max_w;
  int max_k;
  int total;
  Resample_Real NUDGE;
  Resample_Real oo_filter_scale;
  Contrib_Bounds *Pcontrib_bounds;
  Contrib *Pcpool_next;
  Contrib *Pcpool;
  Contrib_List *Pcontrib;
  Resample_Real weight;
  Resample_Real half_width;
  Resample_Real center;
  Resample_Real xscale;
  Resample_Real total_weight;
  int right;
  int left;
  int n;
  int k;
  int j;
  int i;
  Boundary_Op in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  uint uVar13;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint local_88;
  Contrib *local_70;
  float local_48;
  int local_3c;
  int local_34;
  int local_30;
  Contrib_List *local_8;
  
  local_8 = (Contrib_List *)
            crnlib_calloc(CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          (size_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (local_8 == (Contrib_List *)0x0) {
    local_8 = (Contrib_List *)0x0;
  }
  else {
    pvVar5 = crnlib_calloc(CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                           (size_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if (pvVar5 == (void *)0x0) {
      crnlib_free((void *)0x19511b);
      local_8 = (Contrib_List *)0x0;
    }
    else {
      fVar6 = 1.0 / in_XMM1_Da;
      fVar7 = (float)in_ESI / (float)in_EDI;
      if (1.0 <= fVar7) {
        local_3c = 0;
        for (local_30 = 0; local_30 < in_ESI; local_30 = local_30 + 1) {
          fVar8 = in_XMM2_Da + (((float)local_30 + 0.5) / fVar7 - 0.5);
          dVar12 = std::floor((double)(ulong)(uint)(fVar8 - in_XMM0_Da * in_XMM1_Da));
          iVar2 = cast_to_int(SUB84(dVar12,0));
          dVar12 = std::ceil((double)(ulong)(uint)(fVar8 + in_XMM0_Da * in_XMM1_Da));
          iVar3 = cast_to_int(SUB84(dVar12,0));
          *(float *)((long)pvVar5 + (long)local_30 * 0xc) = fVar8;
          *(int *)((long)pvVar5 + (long)local_30 * 0xc + 4) = iVar2;
          *(int *)((long)pvVar5 + (long)local_30 * 0xc + 8) = iVar3;
          local_3c = (iVar3 - iVar2) + 1 + local_3c;
        }
        if ((local_3c == 0) ||
           (local_70 = (Contrib *)
                       crnlib_calloc(CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                     CONCAT44(local_3c,in_stack_ffffffffffffff68),
                                     (size_t *)
                                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)),
           local_70 == (Contrib *)0x0)) {
          crnlib_free((void *)0x19577b);
          crnlib_free((void *)0x195785);
          return (Contrib_List *)0x0;
        }
        for (local_30 = 0; local_30 < in_ESI; local_30 = local_30 + 1) {
          uVar13 = 0xffffffff;
          fVar8 = -1e+20;
          fVar7 = *(float *)((long)pvVar5 + (long)local_30 * 0xc);
          iVar2 = *(int *)((long)pvVar5 + (long)local_30 * 0xc + 4);
          iVar3 = *(int *)((long)pvVar5 + (long)local_30 * 0xc + 8);
          local_8[local_30].n = 0;
          local_8[local_30].p = local_70;
          local_70 = local_70 + ((iVar3 - iVar2) + 1);
          local_48 = 0.0;
          for (local_34 = iVar2; local_34 <= iVar3; local_34 = local_34 + 1) {
            fVar9 = (float)(*in_RCX)((fVar7 - (float)local_34) * fVar6);
            local_48 = fVar9 + local_48;
          }
          fVar9 = 1.0 / local_48;
          local_48 = 0.0;
          for (local_34 = iVar2; local_34 <= iVar3; local_34 = local_34 + 1) {
            fVar10 = (float)(*in_RCX)((fVar7 - (float)local_34) * fVar6);
            fVar10 = fVar10 * fVar9;
            if ((fVar10 != 0.0) || (NAN(fVar10))) {
              iVar2 = reflect((int)fVar8,(int)fVar9,in_stack_ffffffffffffff5c);
              uVar1 = local_8[local_30].n;
              local_8[local_30].n = uVar1 + 1;
              uVar4 = (uint)uVar1;
              local_8[local_30].p[(int)uVar4].pixel = (unsigned_short)iVar2;
              local_8[local_30].p[(int)uVar4].weight = fVar10;
              local_48 = fVar10 + local_48;
              if (fVar8 < fVar10) {
                fVar8 = fVar10;
                uVar13 = uVar4;
              }
            }
          }
          if ((uVar13 == 0xffffffff) || (local_8[local_30].n == 0)) {
            crnlib_free((void *)0x195a2b);
            crnlib_free((void *)0x195a35);
            crnlib_free((void *)0x195a3f);
            return (Contrib_List *)0x0;
          }
          if ((local_48 != 1.0) || (NAN(local_48))) {
            local_8[local_30].p[(int)uVar13].weight =
                 (1.0 - local_48) + local_8[local_30].p[(int)uVar13].weight;
          }
        }
      }
      else {
        fVar8 = (in_XMM0_Da / fVar7) * in_XMM1_Da;
        local_3c = 0;
        for (local_30 = 0; local_30 < in_ESI; local_30 = local_30 + 1) {
          fVar9 = in_XMM2_Da + (((float)local_30 + 0.5) / fVar7 - 0.5);
          dVar12 = std::floor((double)(ulong)(uint)(fVar9 - fVar8));
          iVar2 = cast_to_int(SUB84(dVar12,0));
          dVar12 = std::ceil((double)(ulong)(uint)(fVar9 + fVar8));
          iVar3 = cast_to_int(SUB84(dVar12,0));
          *(float *)((long)pvVar5 + (long)local_30 * 0xc) = fVar9;
          *(int *)((long)pvVar5 + (long)local_30 * 0xc + 4) = iVar2;
          *(int *)((long)pvVar5 + (long)local_30 * 0xc + 8) = iVar3;
          local_3c = (iVar3 - iVar2) + 1 + local_3c;
        }
        if ((local_3c == 0) ||
           (local_70 = (Contrib *)
                       crnlib_calloc(CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                     (size_t *)
                                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)),
           local_70 == (Contrib *)0x0)) {
          crnlib_free((void *)0x1952d8);
          crnlib_free((void *)0x1952e2);
          return (Contrib_List *)0x0;
        }
        for (local_30 = 0; local_30 < in_ESI; local_30 = local_30 + 1) {
          local_88 = 0xffffffff;
          fVar9 = -1e+20;
          fVar8 = *(float *)((long)pvVar5 + (long)local_30 * 0xc);
          iVar2 = *(int *)((long)pvVar5 + (long)local_30 * 0xc + 4);
          iVar3 = *(int *)((long)pvVar5 + (long)local_30 * 0xc + 8);
          local_8[local_30].n = 0;
          local_8[local_30].p = local_70;
          local_70 = local_70 + ((iVar3 - iVar2) + 1);
          local_48 = 0.0;
          for (local_34 = iVar2; local_34 <= iVar3; local_34 = local_34 + 1) {
            fVar10 = (float)(*in_RCX)((fVar8 - (float)local_34) * fVar7 * fVar6);
            local_48 = fVar10 + local_48;
          }
          fVar10 = 1.0 / local_48;
          local_48 = 0.0;
          for (local_34 = iVar2; local_34 <= iVar3; local_34 = local_34 + 1) {
            fVar11 = (float)(*in_RCX)((fVar8 - (float)local_34) * fVar7 * fVar6);
            fVar11 = fVar11 * fVar10;
            if ((fVar11 != 0.0) || (NAN(fVar11))) {
              iVar2 = reflect(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,
                              in_stack_ffffffffffffff5c);
              uVar1 = local_8[local_30].n;
              local_8[local_30].n = uVar1 + 1;
              uVar13 = (uint)uVar1;
              local_8[local_30].p[(int)uVar13].pixel = (unsigned_short)iVar2;
              local_8[local_30].p[(int)uVar13].weight = fVar11;
              local_48 = fVar11 + local_48;
              if (fVar9 < fVar11) {
                fVar9 = fVar11;
                local_88 = uVar13;
              }
            }
          }
          if ((local_88 == 0xffffffff) || (local_8[local_30].n == 0)) {
            crnlib_free((void *)0x19559c);
            crnlib_free((void *)0x1955a6);
            crnlib_free((void *)0x1955b0);
            return (Contrib_List *)0x0;
          }
          if ((local_48 != 1.0) || (NAN(local_48))) {
            local_8[local_30].p[(int)local_88].weight =
                 (1.0 - local_48) + local_8[local_30].p[(int)local_88].weight;
          }
        }
      }
      crnlib_free((void *)0x195ab4);
    }
  }
  return local_8;
}

Assistant:

Resampler::Contrib_List* Resampler::make_clist(
    int src_x, int dst_x, Boundary_Op boundary_op,
    Resample_Real (*Pfilter)(Resample_Real),
    Resample_Real filter_support,
    Resample_Real filter_scale,
    Resample_Real src_ofs) {
  typedef struct
  {
    // The center of the range in DISCRETE coordinates (pixel center = 0.0f).
    Resample_Real center;
    int left, right;
  } Contrib_Bounds;

  int i, j, k, n, left, right;
  Resample_Real total_weight;
  Resample_Real xscale, center, half_width, weight;
  Contrib_List* Pcontrib;
  Contrib* Pcpool;
  Contrib* Pcpool_next;
  Contrib_Bounds* Pcontrib_bounds;

  if ((Pcontrib = (Contrib_List*)crnlib_calloc(dst_x, sizeof(Contrib_List))) == NULL)
    return NULL;

  Pcontrib_bounds = (Contrib_Bounds*)crnlib_calloc(dst_x, sizeof(Contrib_Bounds));
  if (!Pcontrib_bounds) {
    crnlib_free(Pcontrib);
    return (NULL);
  }

  const Resample_Real oo_filter_scale = 1.0f / filter_scale;

  const Resample_Real NUDGE = 0.5f;
  xscale = dst_x / (Resample_Real)src_x;

  if (xscale < 1.0f) {
    int total;
    (void)total;

    /* Handle case when there are fewer destination
         * samples than source samples (downsampling/minification).
         */

    // stretched half width of filter
    half_width = (filter_support / xscale) * filter_scale;

    // Find the range of source sample(s) that will contribute to each destination sample.

    for (i = 0, n = 0; i < dst_x; i++) {
      // Convert from discrete to continuous coordinates, scale, then convert back to discrete.
      center = ((Resample_Real)i + NUDGE) / xscale;
      center -= NUDGE;
      center += src_ofs;

      left = cast_to_int((Resample_Real)floor(center - half_width));
      right = cast_to_int((Resample_Real)ceil(center + half_width));

      Pcontrib_bounds[i].center = center;
      Pcontrib_bounds[i].left = left;
      Pcontrib_bounds[i].right = right;

      n += (right - left + 1);
    }

    /* Allocate memory for contributors. */

    if ((n == 0) || ((Pcpool = (Contrib*)crnlib_calloc(n, sizeof(Contrib))) == NULL)) {
      crnlib_free(Pcontrib);
      crnlib_free(Pcontrib_bounds);
      return NULL;
    }
    total = n;

    Pcpool_next = Pcpool;

    /* Create the list of source samples which
         * contribute to each destination sample.
         */

    for (i = 0; i < dst_x; i++) {
      int max_k = -1;
      Resample_Real max_w = -1e+20f;

      center = Pcontrib_bounds[i].center;
      left = Pcontrib_bounds[i].left;
      right = Pcontrib_bounds[i].right;

      Pcontrib[i].n = 0;
      Pcontrib[i].p = Pcpool_next;
      Pcpool_next += (right - left + 1);
      resampler_assert((Pcpool_next - Pcpool) <= total);

      total_weight = 0;

      for (j = left; j <= right; j++)
        total_weight += (*Pfilter)((center - (Resample_Real)j) * xscale * oo_filter_scale);
      const Resample_Real norm = static_cast<Resample_Real>(1.0f / total_weight);

      total_weight = 0;

#if RESAMPLER_DEBUG
      printf("%i: ", i);
#endif

      for (j = left; j <= right; j++) {
        weight = (*Pfilter)((center - (Resample_Real)j) * xscale * oo_filter_scale) * norm;
        if (weight == 0.0f)
          continue;

        n = reflect(j, src_x, boundary_op);

#if RESAMPLER_DEBUG
        printf("%i(%f), ", n, weight);
#endif

        /* Increment the number of source
               * samples which contribute to the
               * current destination sample.
               */

        k = Pcontrib[i].n++;

        Pcontrib[i].p[k].pixel = (unsigned short)n; /* store src sample number */
        Pcontrib[i].p[k].weight = weight;           /* store src sample weight */

        total_weight += weight; /* total weight of all contributors */

        if (weight > max_w) {
          max_w = weight;
          max_k = k;
        }
      }

#if RESAMPLER_DEBUG
      printf("\n\n");
#endif

      //resampler_assert(Pcontrib[i].n);
      //resampler_assert(max_k != -1);
      if ((max_k == -1) || (Pcontrib[i].n == 0)) {
        crnlib_free(Pcpool);
        crnlib_free(Pcontrib);
        crnlib_free(Pcontrib_bounds);
        return NULL;
      }

      if (total_weight != 1.0f)
        Pcontrib[i].p[max_k].weight += 1.0f - total_weight;
    }
  } else {
    /* Handle case when there are more
         * destination samples than source
         * samples (upsampling).
         */

    half_width = filter_support * filter_scale;

    // Find the source sample(s) that contribute to each destination sample.

    for (i = 0, n = 0; i < dst_x; i++) {
      // Convert from discrete to continuous coordinates, scale, then convert back to discrete.
      center = ((Resample_Real)i + NUDGE) / xscale;
      center -= NUDGE;
      center += src_ofs;

      left = cast_to_int((Resample_Real)floor(center - half_width));
      right = cast_to_int((Resample_Real)ceil(center + half_width));

      Pcontrib_bounds[i].center = center;
      Pcontrib_bounds[i].left = left;
      Pcontrib_bounds[i].right = right;

      n += (right - left + 1);
    }

    /* Allocate memory for contributors. */

    int total = n;
    if ((total == 0) || ((Pcpool = (Contrib*)crnlib_calloc(total, sizeof(Contrib))) == NULL)) {
      crnlib_free(Pcontrib);
      crnlib_free(Pcontrib_bounds);
      return NULL;
    }

    Pcpool_next = Pcpool;

    /* Create the list of source samples which
         * contribute to each destination sample.
         */

    for (i = 0; i < dst_x; i++) {
      int max_k = -1;
      Resample_Real max_w = -1e+20f;

      center = Pcontrib_bounds[i].center;
      left = Pcontrib_bounds[i].left;
      right = Pcontrib_bounds[i].right;

      Pcontrib[i].n = 0;
      Pcontrib[i].p = Pcpool_next;
      Pcpool_next += (right - left + 1);
      resampler_assert((Pcpool_next - Pcpool) <= total);

      total_weight = 0;
      for (j = left; j <= right; j++)
        total_weight += (*Pfilter)((center - (Resample_Real)j) * oo_filter_scale);

      const Resample_Real norm = static_cast<Resample_Real>(1.0f / total_weight);

      total_weight = 0;

#if RESAMPLER_DEBUG
      printf("%i: ", i);
#endif

      for (j = left; j <= right; j++) {
        weight = (*Pfilter)((center - (Resample_Real)j) * oo_filter_scale) * norm;
        if (weight == 0.0f)
          continue;

        n = reflect(j, src_x, boundary_op);

#if RESAMPLER_DEBUG
        printf("%i(%f), ", n, weight);
#endif

        /* Increment the number of source
               * samples which contribute to the
               * current destination sample.
               */

        k = Pcontrib[i].n++;

        Pcontrib[i].p[k].pixel = (unsigned short)n; /* store src sample number */
        Pcontrib[i].p[k].weight = weight;           /* store src sample weight */

        total_weight += weight; /* total weight of all contributors */

        if (weight > max_w) {
          max_w = weight;
          max_k = k;
        }
      }

#if RESAMPLER_DEBUG
      printf("\n\n");
#endif

      //resampler_assert(Pcontrib[i].n);
      //resampler_assert(max_k != -1);

      if ((max_k == -1) || (Pcontrib[i].n == 0)) {
        crnlib_free(Pcpool);
        crnlib_free(Pcontrib);
        crnlib_free(Pcontrib_bounds);
        return NULL;
      }

      if (total_weight != 1.0f)
        Pcontrib[i].p[max_k].weight += 1.0f - total_weight;
    }
  }

#if RESAMPLER_DEBUG
  printf("*******\n");
#endif

  crnlib_free(Pcontrib_bounds);

  return Pcontrib;
}